

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O0

void StringFormatter<unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_char_&,_unsigned_short_&,_unsigned_int_&,_unsigned_long_&>
     ::format<unsigned_long>(ostream *os,char *fmt,unsigned_long *value)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  runtime_error *this;
  bool bVar5;
  bool bVar6;
  char local_4e;
  int local_4c;
  char type;
  bool haveprecision;
  int precision;
  bool havewidth;
  char *pcStack_40;
  int width;
  char *q;
  char padchar;
  bool forcesign;
  char *pcStack_30;
  bool leftadjust;
  char *p;
  unsigned_long *puStack_20;
  bool used_value;
  unsigned_long *value_local;
  char *fmt_local;
  ostream *os_local;
  
  p._7_1_ = 0;
  pcStack_30 = fmt;
  puStack_20 = value;
  value_local = (unsigned_long *)fmt;
  fmt_local = (char *)os;
  while( true ) {
    while( true ) {
      if (*pcStack_30 == '\0') {
        if ((p._7_1_ & 1) != 0) {
          return;
        }
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"too many arguments for format");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (*pcStack_30 == '%') break;
      cVar1 = *pcStack_30;
      pcStack_30 = pcStack_30 + 1;
      std::operator<<((ostream *)fmt_local,cVar1);
    }
    pcVar2 = pcStack_30 + 1;
    if (*pcVar2 != '%') break;
    pcStack_30 = pcStack_30 + 2;
    std::operator<<((ostream *)fmt_local,*pcVar2);
  }
  q._7_1_ = *pcVar2 == '-';
  if ((bool)q._7_1_) {
    pcVar2 = pcStack_30 + 2;
  }
  pcStack_30 = pcVar2;
  q._6_1_ = 0;
  if (*pcStack_30 == '+') {
    pcStack_30 = pcStack_30 + 1;
    q._6_1_ = 1;
  }
  else if (*pcStack_30 == ' ') {
    pcStack_30 = pcStack_30 + 1;
  }
  q._5_1_ = 0x20;
  if (*pcStack_30 == '0') {
    pcStack_30 = pcStack_30 + 1;
    q._5_1_ = 0x30;
  }
  else if (*pcStack_30 == ',') {
    pcStack_30 = pcStack_30 + 1;
    q._5_1_ = 0x2c;
  }
  lVar3 = strtol(pcStack_30,&stack0xffffffffffffffc0,10);
  bVar5 = pcStack_30 == pcStack_40;
  pcStack_30 = pcStack_40;
  local_4c = 0;
  bVar6 = false;
  if (*pcStack_40 == '.') {
    pcStack_30 = pcStack_40 + 1;
    lVar4 = strtol(pcStack_30,&stack0xffffffffffffffc0,10);
    local_4c = (int)lVar4;
    bVar6 = pcStack_30 != pcStack_40;
    pcStack_30 = pcStack_40;
  }
  while (pcVar2 = strchr("qhlLzjt",(int)*pcStack_30), pcVar2 != (char *)0x0) {
    pcStack_30 = pcStack_30 + 1;
  }
  pcVar2 = pcStack_30;
  if ((*pcStack_30 == 'I') &&
     ((pcStack_30[2] == '6' || (pcVar2 = pcStack_30 + 1, pcStack_30[2] == '4')))) {
    pcVar2 = pcStack_30 + 3;
  }
  pcStack_30 = pcVar2;
  local_4e = '\0';
  if (*pcStack_30 != '\0') {
    local_4e = *pcStack_30;
    pcStack_30 = pcStack_30 + 1;
  }
  applytype((ostream *)fmt_local,local_4e);
  if ((q._6_1_ & 1) == 0) {
    std::ostream::operator<<(fmt_local,std::noshowpos);
  }
  else {
    std::ostream::operator<<(fmt_local,std::showpos);
  }
  if ((q._7_1_ & 1) == 0) {
    if ((q._6_1_ & 1) != 0) {
      std::ostream::operator<<(fmt_local,std::internal);
    }
  }
  else {
    std::ostream::operator<<(fmt_local,std::left);
  }
  if (bVar5) {
    std::ios_base::width((ios_base *)(fmt_local + *(long *)(*(long *)fmt_local + -0x18)),0);
  }
  else {
    std::ios_base::width
              ((ios_base *)(fmt_local + *(long *)(*(long *)fmt_local + -0x18)),(long)(int)lVar3);
    if (((q._7_1_ & 1) == 0) && ((q._6_1_ & 1) == 0)) {
      std::ostream::operator<<(fmt_local,std::right);
    }
  }
  if (bVar6) {
    std::ios_base::precision
              ((ios_base *)(fmt_local + *(long *)(*(long *)fmt_local + -0x18)),(long)local_4c);
  }
  std::ios::fill((char)fmt_local + (char)*(undefined8 *)(*(long *)fmt_local + -0x18));
  if ((((((local_4e != 'c') ||
         (bVar6 = output_wchar<unsigned_long>((ostream *)fmt_local,puStack_20), !bVar6)) &&
        ((local_4e != 'p' ||
         (bVar6 = output_pointer<unsigned_long>((ostream *)fmt_local,puStack_20), !bVar6)))) &&
       ((local_4e != 'b' ||
        (bVar6 = output_hex_data<unsigned_long>((ostream *)fmt_local,puStack_20), !bVar6)))) &&
      ((pcVar2 = strchr("iduoxX",(int)local_4e), pcVar2 == (char *)0x0 ||
       (bVar6 = output_int<unsigned_long>((ostream *)fmt_local,*puStack_20), !bVar6)))) &&
     (((local_4e != 's' ||
       (bVar6 = output_null<unsigned_long>((ostream *)fmt_local,*puStack_20), !bVar6)) &&
      (bVar6 = output_using_operator<unsigned_long>((ostream *)fmt_local,puStack_20), !bVar6)))) {
    std::operator<<((ostream *)fmt_local,"<?>");
  }
  std::ios_base::precision((ios_base *)(fmt_local + *(long *)(*(long *)fmt_local + -0x18)),0);
  p._7_1_ = 1;
  format((ostream *)fmt_local,pcStack_30);
  return;
}

Assistant:

static void format(std::ostream& os, const char *fmt, T& value, FARGS&&...args) 
    {
        bool used_value = false;
        const char *p= fmt;
        while (*p) {
            if (*p=='%') {
                p++;
                if (*p=='%') {
                    os << *p++;
                }
                else {

                    // '-'  means left adjust
                    bool leftadjust= false;
                    if (*p=='-') {
                        p++;
                        leftadjust= true;
                    }
                    bool forcesign= false;
                    //bool blankforpositive= false;
                    if (*p=='+') {
                        p++;
                        forcesign= true;
                    }
                    else if (*p==' ') {
                        p++;
                        //blankforpositive= true;  // <-- todo
                    }
                    
                    // '0' means pad with zero
                    // ',' is useful for arrays
                    char padchar= ' ';

                    if (*p=='0') { p++; padchar='0'; }
                    else if (*p==',') { p++; padchar=','; }

                    // width specification
                    char *q;
                    // todo: support '*'  : take size from argumentlist.
                    // todo: support '#'  : adds 0, 0x, 0X prefix to oct/hex numbers -> 'showbase'
                    int width= strtol(p, &q, 10);
                    bool havewidth= p!=q;
                    p= q;

                    // precision after '.'
                    int precision= 0;
                    bool haveprecision= false;
                    if (*p=='.') {
                        p++;
                        // todo: support '*'
                        precision= strtol(p, &q, 10);
                        haveprecision= p!=q;
                        p= q;
                    }

                    // ignore argument size field
                    while (std::strchr("qhlLzjt", *p))
                        p++;
                    if (*p=='I') {
                        // microsoft I64 specifier
                        p++;
                        if (p[1]=='6' || p[1]=='4') {
                            p+=2;
                        }
                    }

                    char type= 0;
                    if (*p)
                        type= *p++;

                    // use formatting
                    applytype(os, type);
                    if (forcesign)
                        os << std::showpos;
                    else
                        os << std::noshowpos;

                    if (leftadjust)
                        os << std::left;
                    else if (forcesign) {
                        // exception: when forcing display of sign
                        // we need to use 'internal fill'
                        os << std::internal;
                    }

                    if (havewidth) {
                        os.width(width);
                        if (!leftadjust && !forcesign)
                            os << std::right;
                    }
                    else {
                        os.width(0);
                    }
                    // todo: support precision(truncate) for strings
                    if (haveprecision)
                        os.precision(precision);
                    os.fill(padchar);

                    if (type=='c' && output_wchar(os, value))
                    {
                        // nop
                    }
                    else if (type=='p' && output_pointer(os, value))
                    {
                        // nop
                    }
                    else if (type=='b' && output_hex_data(os, value))
                    {
                        // nop
                    }
                    else if (std::strchr("iduoxX", type) && output_int(os, value))
                    {
                        // nop
                    }
                    else if (type=='s' && output_null(os, value))
                    {
                        // nop
                    }
                    else if (output_using_operator(os, value))
                    {
                        // when type ~ float/double : '[AEFGaefg]' || type == 's' || other outputs failed.
                        // nop
                    }
                    else {
                        os << "<?>";
                    }

                    // TODO: improve float formatting

                    // reset precision
                    os.precision(0);

                    used_value = true;

                    format(os, p, args...);
                    return;
                }
            }
            else {
                os << *p++;
            }
        }

        if (!used_value)
            throw std::runtime_error("too many arguments for format");
    }